

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O3

int __thiscall QHeaderView::visualIndex(QHeaderView *this,int logicalIndex)

{
  QAbstractItemViewPrivate *this_00;
  ulong uVar1;
  int iVar2;
  
  if (-1 < logicalIndex) {
    this_00 = *(QAbstractItemViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    if ((this_00->delayedPendingLayout == true) && (this_00->state != CollapsingState)) {
      QAbstractItemViewPrivate::interruptDelayedItemsLayout(this_00);
      (**(code **)(**(long **)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                               super_QWidgetPrivate.field_0x8 + 0x220))();
    }
    iVar2 = count(this);
    if (logicalIndex < iVar2) {
      if (*(int *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                   super_QWidgetPrivate.statusTip.d.ptr == 0) {
        return logicalIndex;
      }
      uVar1 = *(ulong *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                         super_QWidgetPrivate.field_0x28;
      if (uVar1 == 0) {
        if (logicalIndex <
            *(int *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                     super_QWidgetPrivate.statusTip.d.d) {
          return logicalIndex;
        }
      }
      else if ((uint)logicalIndex < uVar1) {
        return *(int *)(*(long *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                  super_QWidgetPrivate.field_0x20 + (ulong)(uint)logicalIndex * 4);
      }
    }
  }
  return -1;
}

Assistant:

int QHeaderView::visualIndex(int logicalIndex) const
{
    Q_D(const QHeaderView);
    if (logicalIndex < 0)
        return -1;
    d->executePostedLayout();

    if (logicalIndex >= count())
        return -1;

    if (d->noSectionMemoryUsage())
        return logicalIndex;

    if (d->visualIndices.isEmpty()) { // nothing has been moved, so we have no mapping
        if (logicalIndex < d->sectionCount())
            return logicalIndex;
    } else if (logicalIndex < d->visualIndices.size()) {
        int visual = d->visualIndices.at(logicalIndex);
        Q_ASSERT(visual < d->sectionCount());
        return visual;
    }
    return -1;
}